

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall
draco::EntryValue::GetValue<unsigned_char>
          (EntryValue *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  reference __dest;
  const_reference __src;
  size_type __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t data_type_size;
  size_type in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool local_1;
  
  local_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (in_stack_ffffffffffffffd0);
  if (!local_1) {
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(size_type)in_RDI);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_RSI,in_stack_ffffffffffffffb8);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    memcpy(__dest,__src,__n);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool GetValue(std::vector<DataTypeT> *value) const {
    if (data_.empty()) {
      return false;
    }
    const size_t data_type_size = sizeof(DataTypeT);
    if (data_.size() % data_type_size != 0) {
      return false;
    }
    value->resize(data_.size() / data_type_size);
    memcpy(&value->at(0), &data_[0], data_.size());
    return true;
  }